

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthBooleanDiffCount(uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_34;
  int Counter;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  local_34 = 0;
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x3d6,"int Kit_TruthBooleanDiffCount(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[Step] ^ pTruth[Step] >> 1) & 0x55555555);
      local_34 = iVar2 + local_34;
    }
    pTruth_local._4_4_ = local_34;
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[Step] ^ pTruth[Step] >> 2) & 0x33333333);
      local_34 = iVar2 + local_34;
    }
    pTruth_local._4_4_ = local_34;
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[Step] ^ pTruth[Step] >> 4) & 0xf0f0f0f);
      local_34 = iVar2 + local_34;
    }
    pTruth_local._4_4_ = local_34;
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[Step] ^ pTruth[Step] >> 8) & 0xff00ff);
      local_34 = iVar2 + local_34;
    }
    pTruth_local._4_4_ = local_34;
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[Step] ^ pTruth[Step] >> 0x10) & 0xffff);
      local_34 = iVar2 + local_34;
    }
    pTruth_local._4_4_ = local_34;
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pTruth;
    for (Counter = 0; Counter < iVar1; Counter = iVar2 * 2 + Counter) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        iVar3 = Kit_WordCountOnes(_iVar_local[Step] ^ _iVar_local[iVar2 + Step]);
        local_34 = iVar3 + local_34;
      }
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
    pTruth_local._4_4_ = local_34;
  }
  return pTruth_local._4_4_;
}

Assistant:

int Kit_TruthBooleanDiffCount( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Counter = 0;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 1)) & 0x55555555 );
        return Counter;
    case 1:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 2)) & 0x33333333 );
        return Counter;
    case 2:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 4)) & 0x0F0F0F0F );
        return Counter;
    case 3:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >> 8)) & 0x00FF00FF );
        return Counter;
    case 4:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes( (pTruth[i] ^ (pTruth[i] >>16)) & 0x0000FFFF );
        return Counter;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                Counter += Kit_WordCountOnes( pTruth[i] ^ pTruth[Step+i] );
            pTruth += 2*Step;
        }
        return Counter;
    }
}